

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O1

CodeLocation __thiscall
soul::CodeLocation::getOffset(CodeLocation *this,uint32_t linesToAdd,uint32_t columnsToAdd)

{
  Ptr PVar1;
  UnicodeChar UVar2;
  int in_ECX;
  UTF8Reader extraout_RDX;
  uint32_t uVar3;
  undefined4 in_register_00000034;
  int iVar4;
  CodeLocation CVar5;
  CodeLocation l;
  SourceCodeText *local_48;
  _Alloc_hider local_40;
  Ptr local_38;
  
  local_48 = *(SourceCodeText **)CONCAT44(in_register_00000034,linesToAdd);
  if (local_48 != (SourceCodeText *)0x0) {
    (local_48->super_RefCountedObject).refCount = (local_48->super_RefCountedObject).refCount + 1;
  }
  local_40._M_p = *(pointer *)(CONCAT44(in_register_00000034,linesToAdd) + 8);
  iVar4 = 0;
  uVar3 = 0;
  local_38.object = (SourceCodeText *)this;
  do {
    PVar1.object = local_38.object;
    if (iVar4 == in_ECX && uVar3 == columnsToAdd) {
      *(SourceCodeText **)local_38.object = local_48;
      local_48 = (SourceCodeText *)0x0;
      ((local_38.object)->filename)._M_dataplus._M_p = local_40._M_p;
LAB_001cd62f:
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48);
      CVar5.location.data = extraout_RDX.data;
      CVar5.sourceCode.object = PVar1.object;
      return CVar5;
    }
    if (*local_40._M_p == '\0') {
      *(long *)local_38.object = 0;
      ((local_38.object)->filename)._M_dataplus._M_p = (char *)0x0;
      goto LAB_001cd62f;
    }
    iVar4 = iVar4 + 1;
    UVar2 = UTF8Reader::operator*((UTF8Reader *)&local_40);
    if (UVar2 == 10) {
      iVar4 = 0;
    }
    uVar3 = uVar3 + (UVar2 == 10);
    UTF8Reader::operator++((UTF8Reader *)&local_40);
  } while( true );
}

Assistant:

CodeLocation CodeLocation::getOffset (uint32_t linesToAdd, uint32_t columnsToAdd) const
{
    auto l = *this;
    LineAndColumn lc;

    for (;;)
    {
        if (lc.line == linesToAdd && lc.column == columnsToAdd)
            return l;

        if (l.location.isEmpty())
            return {};

        ++lc.column;
        if (*(l.location) == '\n')  { lc.column = 0; lc.line++; }
        ++(l.location);
    }
}